

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_text.cpp
# Opt level: O0

void Am_Text_Create_Do_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  size_t sVar3;
  Am_Object local_60;
  Am_Object command;
  Am_Object local_48;
  char *local_40;
  char *str;
  Am_String local_28;
  Am_String edited_text;
  Am_Object text;
  bool create_if_zero;
  Am_Object *inter_local;
  
  pAVar2 = Am_Object::Get(inter,0xe7,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  if (!bVar1) {
    pAVar2 = Am_Object::Get(inter,0x16d,0);
    Am_Object::Am_Object((Am_Object *)&edited_text,pAVar2);
    pAVar2 = Am_Object::Get((Am_Object *)&edited_text,0xab,0);
    Am_String::Am_String(&local_28,pAVar2);
    local_40 = Am_String::operator_cast_to_char_(&local_28);
    sVar3 = strlen(local_40);
    if (sVar3 == 0) {
      Am_Object::Am_Object(&local_48,inter);
      Am_Abort_Interactor(&local_48,true);
      Am_Object::~Am_Object(&local_48);
    }
    Am_String::~Am_String(&local_28);
    Am_Object::~Am_Object((Am_Object *)&edited_text);
    if (sVar3 == 0) {
      return;
    }
  }
  Am_Object::Am_Object(&command,inter);
  Am_Text_Do_proc(&command);
  Am_Object::~Am_Object(&command);
  Am_Object::Get_Object(&local_60,(Am_Slot_Key)inter,0xc5);
  Am_Object::~Am_Object(&local_60);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Text_Create_Do, (Am_Object inter))
{
  bool create_if_zero = inter.Get(Am_CREATE_IF_ZERO_LENGTH);
  if (!create_if_zero) {
    Am_Object text = inter.Get(Am_OBJECT_MODIFIED);
    Am_String edited_text = text.Get(Am_TEXT);
    const char *str = edited_text;
    if (strlen(str) == 0) {
      Am_Abort_Interactor(inter);
      return;
    }
  }
  Am_Text_Do_proc(inter);
  Am_Object command = inter.Get_Object(Am_COMMAND);
}